

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Expression * call(void)

{
  int iVar1;
  Token t;
  Token t_00;
  Token t_01;
  TokenList *pTVar2;
  Expression *pEVar3;
  char *pcVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  Expression **ppEVar7;
  char *pcVar8;
  TokenType type;
  ulong uVar9;
  Token *__return_storage_ptr__;
  bool bVar10;
  Token h;
  double d;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  char *pcVar14;
  undefined8 uStack_50;
  Expression *local_40 [4];
  
  pEVar3 = (Expression *)malloc(0x40);
  pEVar3->type = EXPR_NONE;
  if (head == (TokenList *)0x0) {
    bVar10 = false;
  }
  else {
    bVar10 = (head->value).type == TOKEN_TRUE;
  }
  if (bVar10) {
    if (head->next != (TokenList *)0x0) {
      head = head->next;
    }
    if (bVar10) {
      pEVar3->type = EXPR_LITERAL;
      (pEVar3->field_1).binary.line = (head->value).line;
      *(undefined8 *)((long)&pEVar3->field_1 + 4) = 0x100000003;
      goto LAB_001041ca;
    }
  }
  if (head == (TokenList *)0x0) {
    bVar10 = false;
  }
  else {
    bVar10 = (head->value).type == TOKEN_FALSE;
  }
  if (bVar10) {
    if (head->next != (TokenList *)0x0) {
      head = head->next;
    }
    if (bVar10) {
      pEVar3->type = EXPR_LITERAL;
      (pEVar3->field_1).binary.line = (head->value).line;
      *(undefined8 *)((long)&pEVar3->field_1 + 4) = 3;
      goto LAB_001041ca;
    }
  }
  if (head == (TokenList *)0x0) {
    bVar10 = false;
  }
  else {
    bVar10 = (head->value).type == TOKEN_NULL;
  }
  if (bVar10) {
    if (head->next != (TokenList *)0x0) {
      head = head->next;
    }
    if (bVar10) {
      pEVar3->type = EXPR_LITERAL;
      (pEVar3->field_1).binary.line = (head->value).line;
      (pEVar3->field_1).literal.type = LIT_NULL;
      goto LAB_001041ca;
    }
  }
  pTVar2 = head;
  if (head == (TokenList *)0x0) {
LAB_0010415c:
    bVar10 = false;
LAB_0010415e:
    if (bVar10) {
      if (head->next != (TokenList *)0x0) {
        head = head->next;
      }
      if (bVar10) {
        free(pEVar3);
        pEVar3 = expression();
        pcVar8 = "Expected \'(\' after expression.";
        __return_storage_ptr__ = (Token *)&stack0xffffffffffffff98;
        type = TOKEN_RIGHT_PAREN;
LAB_00104197:
        consume(__return_storage_ptr__,type,pcVar8);
        goto LAB_001041ca;
      }
    }
    if (head->next == (TokenList *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (ulong)(uint)(head->value).line;
      head = head->next;
    }
    printf("\x1b[31m\n[Error] [Line:%d] Incorrect expression!\x1b[0m",uVar9);
  }
  else {
    if ((head->value).type == TOKEN_MINUS) {
      pEVar3->type = EXPR_BINARY;
      pEVar5 = (Expression *)malloc(0x40);
      pEVar5->type = EXPR_NONE;
      (pEVar3->field_1).binary.left = pEVar5;
      pEVar5->type = EXPR_LITERAL;
      (pEVar5->field_1).literal.type = LIT_INT;
      (pEVar5->field_1).binary.left = (Expression *)0x0;
      if (pTVar2->next == (TokenList *)0x0) {
        pcVar14 = (char *)0x0;
        uStack_50._0_4_ = -1;
        uStack_50._4_4_ = 0;
        pcVar8 = (char *)0x3c;
        pcVar4 = "BadToken";
      }
      else {
        pcVar8 = *(char **)&pTVar2->value;
        pcVar4 = (pTVar2->value).start;
        pcVar14 = (pTVar2->value).file;
        uStack_50._0_4_ = (pTVar2->value).length;
        uStack_50._4_4_ = (pTVar2->value).line;
        head = pTVar2->next;
      }
      *(char **)((long)&pEVar3->field_1 + 0x20) = pcVar14;
      *(undefined8 *)((long)&pEVar3->field_1 + 0x28) = uStack_50;
      (pEVar3->field_1).arrayExpression.identifier = pcVar8;
      (pEVar3->field_1).callExpression.arguments = (Expression **)pcVar4;
      pEVar5 = expression();
      (pEVar3->field_1).binary.right = pEVar5;
      goto LAB_001041ca;
    }
    if (head == (TokenList *)0x0) goto LAB_0010415c;
    if ((head->value).type == TOKEN_NUMBER) {
      pEVar3->type = EXPR_LITERAL;
      (pEVar3->field_1).binary.line = (pTVar2->value).line;
      if (pTVar2->next == (TokenList *)0x0) {
        pcVar4 = (char *)0x0;
        uStack_50._0_4_ = -1;
        uStack_50._4_4_ = 0;
        uVar11._0_4_ = TOKEN_ERROR;
        uVar11._4_4_ = 0;
        pcVar8 = "BadToken";
      }
      else {
        uVar11._0_4_ = (pTVar2->value).type;
        uVar11._4_4_ = *(undefined4 *)&(pTVar2->value).field_0x4;
        pcVar8 = (pTVar2->value).start;
        pcVar4 = (pTVar2->value).file;
        uStack_50._0_4_ = (pTVar2->value).length;
        uStack_50._4_4_ = (pTVar2->value).line;
        head = pTVar2->next;
      }
      t.start = (char *)uVar11;
      t.type = (int)uStack_50;
      t._4_4_ = uStack_50._4_4_;
      t.file = pcVar8;
      t._24_8_ = pcVar4;
      pcVar4 = stringOf(t);
      for (pcVar8 = pcVar4; *pcVar8 != '\0'; pcVar8 = pcVar8 + 1) {
        if (*pcVar8 == '.') {
          (pEVar3->field_1).literal.type = LIT_DOUBLE;
          __isoc99_sscanf(pcVar4,"%lf",local_40);
          (pEVar3->field_1).binary.left = local_40[0];
          goto LAB_001041ca;
        }
      }
      (pEVar3->field_1).literal.type = LIT_INT;
      __isoc99_sscanf(pcVar4,"%ld",local_40);
    }
    else {
      if (head == (TokenList *)0x0) goto LAB_0010415c;
      if ((head->value).type == TOKEN_STRING) {
        pEVar3->type = EXPR_LITERAL;
        (pEVar3->field_1).binary.line = (pTVar2->value).line;
        (pEVar3->field_1).literal.type = LIT_STRING;
        if (pTVar2->next == (TokenList *)0x0) {
          pcVar4 = (char *)0x0;
          uStack_50._0_4_ = -1;
          uStack_50._4_4_ = 0;
          uVar12._0_4_ = TOKEN_ERROR;
          uVar12._4_4_ = 0;
          pcVar8 = "BadToken";
        }
        else {
          uVar12._0_4_ = (pTVar2->value).type;
          uVar12._4_4_ = *(undefined4 *)&(pTVar2->value).field_0x4;
          pcVar8 = (pTVar2->value).start;
          pcVar4 = (pTVar2->value).file;
          uStack_50._0_4_ = (pTVar2->value).length;
          uStack_50._4_4_ = (pTVar2->value).line;
          head = pTVar2->next;
        }
        t_00.start = (char *)uVar12;
        t_00.type = (int)uStack_50;
        t_00._4_4_ = uStack_50._4_4_;
        t_00.file = pcVar8;
        t_00._24_8_ = pcVar4;
        local_40[0] = (Expression *)stringOf(t_00);
        goto LAB_00104148;
      }
      if (head == (TokenList *)0x0) goto LAB_0010415c;
      if ((head->value).type != TOKEN_IDENTIFIER) {
        if (head == (TokenList *)0x0) goto LAB_0010415c;
        bVar10 = (head->value).type == TOKEN_LEFT_PAREN;
        goto LAB_0010415e;
      }
      if (head->next == (TokenList *)0x0) {
        pcVar4 = (char *)0x0;
        uStack_50._0_4_ = -1;
        uStack_50._4_4_ = 0;
        uVar13._0_4_ = TOKEN_ERROR;
        uVar13._4_4_ = 0;
        pcVar8 = "BadToken";
      }
      else {
        uVar13._0_4_ = (head->value).type;
        uVar13._4_4_ = *(undefined4 *)&(head->value).field_0x4;
        pcVar8 = (head->value).start;
        pcVar4 = (head->value).file;
        uStack_50._0_4_ = (head->value).length;
        uStack_50._4_4_ = (head->value).line;
        head = head->next;
      }
      t_01.start = (char *)uVar13;
      t_01.type = (int)uStack_50;
      t_01._4_4_ = uStack_50._4_4_;
      t_01.file = pcVar8;
      t_01._24_8_ = pcVar4;
      local_40[0] = (Expression *)stringOf(t_01);
      if (head == (TokenList *)0x0) {
        bVar10 = false;
      }
      else {
        bVar10 = (head->value).type == TOKEN_LEFT_SQUARE;
      }
      if (bVar10) {
        if (head->next != (TokenList *)0x0) {
          head = head->next;
        }
        if (bVar10) {
          pEVar3->type = EXPR_ARRAY;
          (pEVar3->field_1).arrayExpression.identifier = (char *)local_40[0];
          (pEVar3->field_1).binary.line = (head->value).line;
          pEVar5 = expression();
          (pEVar3->field_1).binary.left = pEVar5;
          pcVar8 = "Expected \']\' after array index!";
          __return_storage_ptr__ = (Token *)local_40;
          type = TOKEN_RIGHT_SQUARE;
          goto LAB_00104197;
        }
      }
      pEVar3->type = EXPR_VARIABLE;
      (pEVar3->field_1).binary.line = (head->value).line;
    }
LAB_00104148:
    (pEVar3->field_1).binary.left = local_40[0];
  }
LAB_001041ca:
LAB_001041d6:
  while( true ) {
    if (head == (TokenList *)0x0) {
      bVar10 = false;
    }
    else {
      bVar10 = (head->value).type == TOKEN_LEFT_PAREN;
    }
    if (bVar10) break;
LAB_0010424e:
    if (head == (TokenList *)0x0) {
      bVar10 = false;
    }
    else {
      bVar10 = (head->value).type == TOKEN_DOT;
    }
    if (!bVar10) {
      return pEVar3;
    }
    if (head->next != (TokenList *)0x0) {
      head = head->next;
    }
    if (!bVar10) {
      return pEVar3;
    }
    pEVar5 = (Expression *)malloc(0x40);
    pEVar5->type = EXPR_REFERENCE;
    (pEVar5->field_1).binary.line = (head->value).line;
    (pEVar5->field_1).binary.left = pEVar3;
    pEVar3 = call();
    (pEVar5->field_1).referenceExpression.member = pEVar3;
    pEVar3 = pEVar5;
  }
  if (head->next != (TokenList *)0x0) {
    head = head->next;
  }
  if (!bVar10) goto LAB_0010424e;
  pEVar5 = (Expression *)malloc(0x40);
  pEVar5->type = EXPR_CALL;
  (pEVar5->field_1).binary.left = (pEVar3->field_1).binary.left;
  (pEVar5->field_1).binary.op.type = TOKEN_LEFT_PAREN;
  (pEVar5->field_1).callExpression.arguments = (Expression **)0x0;
  pTVar2 = head;
  (pEVar5->field_1).binary.line = (head->value).line;
  if (pTVar2 == (TokenList *)0x0) {
    bVar10 = false;
  }
  else {
    bVar10 = (pTVar2->value).type == TOKEN_RIGHT_PAREN;
  }
  pEVar3 = pEVar5;
  if (bVar10) goto code_r0x001042c3;
  goto LAB_001042de;
code_r0x001042c3:
  if (pTVar2->next != (TokenList *)0x0) {
    head = pTVar2->next;
  }
  if (!bVar10) {
LAB_001042de:
    do {
      pEVar6 = expression();
      iVar1 = (pEVar5->field_1).callExpression.argCount;
      (pEVar5->field_1).binary.op.type = iVar1 + TOKEN_RIGHT_PAREN;
      ppEVar7 = (Expression **)
                realloc((pEVar5->field_1).callExpression.arguments,(long)iVar1 * 8 + 8);
      (pEVar5->field_1).callExpression.arguments = ppEVar7;
      ppEVar7[(long)(pEVar5->field_1).callExpression.argCount + -1] = pEVar6;
      if (head == (TokenList *)0x0) {
        bVar10 = false;
      }
      else {
        bVar10 = (head->value).type == TOKEN_COMMA;
      }
      if (!bVar10) break;
      if (head->next != (TokenList *)0x0) {
        head = head->next;
      }
    } while (bVar10);
    consume((Token *)&stack0xffffffffffffff98,TOKEN_RIGHT_PAREN,"Expected \'(\' after expression!");
  }
  goto LAB_001041d6;
}

Assistant:

static Expression* call(){
    Expression* expr = primary();
    while(true){
        if(match(TOKEN_LEFT_PAREN)){
            expr  = getCall(expr);
        }
        else if(match(TOKEN_DOT)){
            Expression *ex = newExpression();
            ex->type = EXPR_REFERENCE;
            ex->referenceExpression.line = presentLine();
            ex->referenceExpression.containerName = expr;
            ex->referenceExpression.member = call();
            expr = ex;
        }
        else
            break;
    }
    return expr;
}